

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::ArchiveIN(ChParticleCloud *this,ChArchiveIn *marchive)

{
  pointer ppCVar1;
  pointer ppCVar2;
  long lVar3;
  ulong uVar4;
  ChFunctorArchiveInSpecificPtr<chrono::collision::ChCollisionModel> specFuncA;
  ChNameValue<std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>_> local_48;
  undefined **local_30;
  ChCollisionModel **local_28;
  
  ChArchiveIn::VersionRead<chrono::ChParticleCloud>(marchive);
  ChIndexedParticles::ArchiveIN(&this->super_ChIndexedParticles,marchive);
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0xd])(this);
  local_48._value = &this->particles;
  local_48._name = "particles";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChAparticle*>(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&local_30;
  local_28 = &this->particle_collision_model;
  local_30 = &PTR__ChFunctorArchiveIn_00b052c8;
  local_48._name = "particle_collision_model";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x68))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->matsurface;
  local_48._name = "matsurface";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChMaterialSurface>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChMaterialSurface>_> *)&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->do_collide;
  local_48._name = "do_collide";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->do_limit_speed;
  local_48._name = "do_limit_speed";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->max_speed;
  local_48._name = "max_speed";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->max_wvel;
  local_48._name = "max_wvel";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->sleep_time;
  local_48._name = "sleep_time";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->sleep_minspeed;
  local_48._name = "sleep_minspeed";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->sleep_minwvel
  ;
  local_48._name = "sleep_minwvel";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_48);
  local_48._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->sleep_starttime;
  local_48._name = "sleep_starttime";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_48);
  ppCVar2 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2;
  if (lVar3 != 0) {
    uVar4 = 0;
    do {
      ppCVar1 = ppCVar2 + uVar4;
      uVar4 = uVar4 + 1;
      (*ppCVar1)->container = this;
    } while ((uVar4 & 0xffffffff) < (ulong)(lVar3 >> 3));
  }
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0xc])(this);
  return;
}

Assistant:

void ChParticleCloud::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChParticleCloud>();

    // deserialize parent class:
    ChIndexedParticles::ArchiveIN(marchive);

    // deserialize all member data:

    RemoveCollisionModelsFromSystem();

    marchive >> CHNVP(particles);
    // marchive >> CHNVP(particle_mass); //***TODO***
    marchive >> CHNVP(particle_collision_model);
    marchive >> CHNVP(matsurface);
    marchive >> CHNVP(do_collide);
    marchive >> CHNVP(do_limit_speed);
    marchive >> CHNVP(max_speed);
    marchive >> CHNVP(max_wvel);
    marchive >> CHNVP(sleep_time);
    marchive >> CHNVP(sleep_minspeed);
    marchive >> CHNVP(sleep_minwvel);
    marchive >> CHNVP(sleep_starttime);

    for (unsigned int j = 0; j < particles.size(); j++) {
        particles[j]->SetContainer(this);
    }
    AddCollisionModelsToSystem();
}